

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  FieldDescriptor *pFVar4;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var5;
  _Rb_tree_node_base *p_Var6;
  int iVar7;
  JavaType JVar8;
  OneofGeneratorInfo *args_1;
  LogMessage *pLVar9;
  long *plVar10;
  FieldDescriptor **ppFVar11;
  Descriptor *pDVar12;
  undefined8 extraout_RDX;
  ImmutableMessageLiteGenerator *extraout_RDX_00;
  ImmutableMessageLiteGenerator *extraout_RDX_01;
  ImmutableMessageLiteGenerator *pIVar13;
  ulong uVar14;
  long lVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  string line;
  LogFinisher local_f1;
  Printer *local_f0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_e8;
  string local_c8;
  undefined1 local_a0 [56];
  LogMessage local_68;
  
  io::Printer::Indent(printer);
  local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar12 = (this->super_MessageGenerator).descriptor_;
  bVar21 = *(char *)(*(long *)(pDVar12 + 0x10) + 0x3a) == '\x02';
  uVar16 = bVar21 + 2;
  if (*(char *)(*(long *)(pDVar12 + 0x20) + 0x48) == '\0') {
    uVar16 = (uint32_t)bVar21;
  }
  WriteUInt32ToUtf16CharSequence(uVar16,&local_e8);
  WriteUInt32ToUtf16CharSequence
            (*(uint32_t *)((this->super_MessageGenerator).descriptor_ + 4),&local_e8);
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 4) == 0) {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = null;");
  }
  else {
    io::Printer::Print<>(printer,"java.lang.Object[] objects = new java.lang.Object[] {\n");
    io::Printer::Indent(printer);
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)
               (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count,&local_e8);
    auVar22._8_8_ = extraout_RDX;
    auVar22._0_8_ =
         (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    local_f0 = printer;
    while( true ) {
      p_Var6 = auVar22._0_8_;
      if ((_Rb_tree_header *)p_Var6 ==
          &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header) break;
      args_1 = Context::GetOneofGeneratorInfo(this->context_,*(OneofDescriptor **)(p_Var6 + 1));
      io::Printer::Print<char[11],std::__cxx11::string>
                (local_f0,"\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n",(char (*) [11])0x3fc475,
                 &args_1->name);
      auVar22 = std::_Rb_tree_increment(p_Var6);
    }
    pDVar12 = (this->super_MessageGenerator).descriptor_;
    if (*(int *)(pDVar12 + 4) < 1) {
      iVar19 = 0;
      pIVar13 = auVar22._8_8_;
    }
    else {
      lVar18 = 0;
      lVar15 = 0;
      iVar19 = 0;
      do {
        lVar2 = *(long *)(pDVar12 + 0x28);
        if (*(Descriptor **)(lVar2 + 0x20 + lVar18) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          pLVar9 = internal::LogMessage::operator<<
                             (&local_68,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=((LogFinisher *)local_a0,pLVar9);
          internal::LogMessage::~LogMessage(&local_68);
        }
        if ((*(byte *)(lVar2 + 1 + lVar18) & 8) == 0) {
          plVar10 = (long *)(*(long *)(lVar2 + 0x20 + lVar18) + 0x28);
        }
        else {
          lVar3 = *(long *)(lVar2 + 0x28 + lVar18);
          if (lVar3 == 0) {
            plVar10 = (long *)(*(long *)(lVar2 + 0x10 + lVar18) + 0x70);
          }
          else {
            plVar10 = (long *)(lVar3 + 0x50);
          }
        }
        iVar7 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(int)((ulong)((lVar2 - *plVar10) + lVar18) >> 3) * 0x38e38e39
                                      ]._M_t.
                                      super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                                      ._M_t + 0x10))();
        iVar19 = iVar19 + iVar7;
        lVar15 = lVar15 + 1;
        pDVar12 = (this->super_MessageGenerator).descriptor_;
        lVar18 = lVar18 + 0x48;
        pIVar13 = this;
      } while (lVar15 < *(int *)(pDVar12 + 4));
    }
    iVar7 = iVar19 + 0x3e;
    if (-1 < iVar19 + 0x1f) {
      iVar7 = iVar19 + 0x1f;
    }
    uVar16 = iVar7 >> 5;
    if (0 < iVar19) {
      uVar17 = 1;
      if (1 < (int)uVar16) {
        uVar17 = uVar16;
      }
      uVar20 = 0;
      do {
        GetBitFieldName_abi_cxx11_((string *)local_a0,(java *)(ulong)uVar20,(int)pIVar13);
        io::Printer::Print<char[15],std::__cxx11::string>
                  (local_f0,"\"$bit_field_name$\",\n",(char (*) [15])"bit_field_name",
                   (string *)local_a0);
        pIVar13 = extraout_RDX_00;
        if ((FieldDescriptor *)local_a0._0_8_ != (FieldDescriptor *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_);
          pIVar13 = extraout_RDX_01;
        }
        uVar20 = uVar20 + 1;
      } while (uVar17 != uVar20);
    }
    WriteUInt32ToUtf16CharSequence(uVar16,&local_e8);
    ppFVar11 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    if (*(int *)((this->super_MessageGenerator).descriptor_ + 4) < 1) {
      uVar17 = 0;
      uVar16 = 0;
    }
    else {
      lVar15 = 0;
      uVar16 = 0;
      uVar17 = 0;
      do {
        pFVar4 = ppFVar11[lVar15];
        if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
          local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
          local_c8._M_dataplus._M_p = (pointer)pFVar4;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_a0,
                     (FieldDescriptor **)&local_c8);
        }
        if ((pFVar4[2] == (FieldDescriptor)0xb) &&
           (bVar21 = FieldDescriptor::is_map_message_type(pFVar4), bVar21)) {
          uVar17 = uVar17 + 1;
        }
        else {
          uVar16 = uVar16 + ((~(byte)pFVar4[1] & 0x60) == 0);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < *(int *)((this->super_MessageGenerator).descriptor_ + 4));
    }
    WriteUInt32ToUtf16CharSequence(*(uint32_t *)(*ppFVar11 + 4),&local_e8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)
                (ppFVar11[(long)*(int *)((this->super_MessageGenerator).descriptor_ + 4) + -1] + 4),
               &local_e8);
    WriteUInt32ToUtf16CharSequence
              (*(uint32_t *)((this->super_MessageGenerator).descriptor_ + 4),&local_e8);
    WriteUInt32ToUtf16CharSequence(uVar17,&local_e8);
    WriteUInt32ToUtf16CharSequence(uVar16,&local_e8);
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity = 0;
    pDVar12 = (this->super_MessageGenerator).descriptor_;
    if (0 < *(int *)(pDVar12 + 4)) {
      lVar15 = 0;
      lVar18 = 0;
      do {
        if ((*(byte *)(*(long *)(pDVar12 + 0x28) + 1 + lVar15) & 0x60) == 0x40) {
LAB_002d5ad2:
          local_a0._0_8_ = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar15;
          if (local_c8._M_string_length == local_c8.field_2._M_allocated_capacity) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&local_c8,(iterator)local_c8._M_string_length,(FieldDescriptor **)local_a0
                      );
          }
          else {
            *(undefined8 *)local_c8._M_string_length = local_a0._0_8_;
            local_c8._M_string_length = local_c8._M_string_length + 8;
          }
        }
        else {
          JVar8 = GetJavaType((FieldDescriptor *)(*(long *)(pDVar12 + 0x28) + lVar15));
          if (JVar8 == JAVATYPE_MESSAGE) {
            pDVar12 = FieldDescriptor::message_type
                                ((FieldDescriptor *)
                                 (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) +
                                 lVar15));
            bVar21 = HasRequiredFields(pDVar12);
            if (bVar21) goto LAB_002d5ad2;
          }
        }
        lVar18 = lVar18 + 1;
        pDVar12 = (this->super_MessageGenerator).descriptor_;
        lVar15 = lVar15 + 0x48;
      } while (lVar18 < *(int *)(pDVar12 + 4));
    }
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p >> 3),
               &local_e8);
    if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 4)) {
      lVar15 = 0;
      do {
        pFVar4 = ppFVar11[lVar15];
        if (*(Descriptor **)(pFVar4 + 0x20) != (this->field_generators_).descriptor_) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                     ,0x8a);
          pLVar9 = internal::LogMessage::operator<<
                             ((LogMessage *)local_a0,
                              "CHECK failed: (field->containing_type()) == (descriptor_): ");
          internal::LogFinisher::operator=(&local_f1,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)local_a0);
        }
        if (((byte)pFVar4[1] & 8) == 0) {
          plVar10 = (long *)(*(long *)(pFVar4 + 0x20) + 0x28);
        }
        else if (*(long *)(pFVar4 + 0x28) == 0) {
          plVar10 = (long *)(*(long *)(pFVar4 + 0x10) + 0x70);
        }
        else {
          plVar10 = (long *)(*(long *)(pFVar4 + 0x28) + 0x50);
        }
        _Var5._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
        .
        super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
        ._M_head_impl =
             (this->field_generators_).field_generators_.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(int)((ulong)((long)pFVar4 - *plVar10) >> 3) * 0x38e38e39]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
             ._M_t;
        (**(code **)(*(long *)_Var5._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                              ._M_head_impl + 0x38))
                  (_Var5._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                   ._M_head_impl,local_f0,&local_e8);
        lVar15 = lVar15 + 1;
      } while (lVar15 < *(int *)((this->super_MessageGenerator).descriptor_ + 4));
    }
    io::Printer::Outdent(local_f0);
    io::Printer::Print<>(local_f0,"};\n");
    if ((FieldDescriptor *)local_c8._M_dataplus._M_p != (FieldDescriptor *)0x0) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    operator_delete__(ppFVar11);
    printer = local_f0;
  }
  io::Printer::Print<>(printer,"java.lang.String info =\n");
  paVar1 = &local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_allocated_capacity =
       local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  if (local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    do {
      EscapeUtf16ToString(local_e8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar14],&local_c8);
      if (0x4f < local_c8._M_string_length) {
        io::Printer::Print<char[7],std::__cxx11::string>
                  (printer,"    \"$string$\" +\n",(char (*) [7])0x43fab9,&local_c8);
        local_c8._M_string_length = 0;
        *local_c8._M_dataplus._M_p = '\0';
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)local_e8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1));
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,"    \"$string$\";\n",(char (*) [7])0x43fab9,&local_c8);
  io::Printer::Print<>(printer,"return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  io::Printer::Outdent(printer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16_t> chars;

  int flags = 0;
  if (IsProto2(descriptor_->file())) {
    flags |= 0x1;
  }
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(oneofs_.size(), &chars);
    for (auto oneof : oneofs_) {
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16_t code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}